

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::NetworkUpdateParameters::MergePartialFromCodedStream
          (NetworkUpdateParameters *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  LossLayer *value;
  Int64Parameter *value_00;
  BoolParameter *value_01;
  Optimizer *value_02;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  
  do {
    pbVar3 = input->buffer_;
    uVar5 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar5 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar7, (~(uint)*pbVar1 & uVar7) < 0x80))
        goto LAB_00529094;
        uVar8 = (ulong)((uVar7 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar8 = uVar8 | 0x100000000;
    }
    else {
LAB_00529094:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x3fff) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto switchD_00529003_caseD_4;
    uVar7 = (uint)(uVar8 >> 3) & 0x1fffffff;
    cVar6 = (char)uVar8;
    switch(uVar7) {
    case 1:
      if (cVar6 != '\n') break;
      value = google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::Add
                        (&this->losslayers_);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::LossLayer>(input,value);
      goto LAB_00528fe1;
    case 2:
      if (cVar6 == '\x12') {
        value_02 = mutable_optimizer(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Optimizer>(input,value_02);
        goto LAB_00528fe1;
      }
      break;
    case 3:
      if (cVar6 == '\x1a') {
        value_00 = mutable_epochs(this);
LAB_00529043:
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Int64Parameter>(input,value_00);
        goto LAB_00528fe1;
      }
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
      break;
    case 10:
      if (cVar6 == 'R') {
        value_01 = mutable_shuffle(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::BoolParameter>(input,value_01);
        goto LAB_00528fe1;
      }
      break;
    default:
      if ((uVar7 == 0x14) && (cVar6 == -0x5e)) {
        value_00 = mutable_seed(this);
        goto LAB_00529043;
      }
    }
switchD_00529003_caseD_4:
    if (uVar5 == 0) {
      return true;
    }
    if ((uVar5 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_00528fe1:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool NetworkUpdateParameters::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NetworkUpdateParameters)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.LossLayer lossLayers = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_losslayers()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Optimizer optimizer = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_optimizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter epochs = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_epochs()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BoolParameter shuffle = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_shuffle()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter seed = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_seed()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NetworkUpdateParameters)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NetworkUpdateParameters)
  return false;
#undef DO_
}